

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::openPersistentEditor(QAbstractItemView *this,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  uint uVar1;
  QWidget *this_01;
  long in_FS_OFFSET;
  QWidget *copy;
  QModelIndex local_118;
  QHashDummyValue local_f9;
  QStyleOptionViewItem local_f8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  memset(&local_f8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_f8);
  (**(code **)(*(long *)this + 0x2f8))(this,&local_f8);
  local_f8.super_QStyleOption.rect = (QRect)(**(code **)(*(long *)this + 0x1e0))(this,index);
  currentIndex(&local_118,this);
  uVar1 = 0;
  if (((index->r == local_118.r) && (uVar1 = 0, index->c == local_118.c)) &&
     (index->i == local_118.i)) {
    uVar1 = (uint)((index->m).ptr == local_118.m.ptr) << 8;
  }
  local_f8.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       ((uint)local_f8.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i | uVar1);
  this_01 = QAbstractItemViewPrivate::editor(this_00,index,&local_f8);
  if (this_01 != (QWidget *)0x0) {
    QWidget::show(this_01);
    local_118._0_8_ = this_01;
    QHash<QWidget*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QWidget*,QHashDummyValue> *)&this_00->persistent,(QWidget **)&local_118,
               &local_f9);
  }
  QBrush::~QBrush(&local_f8.backgroundBrush);
  if (&(local_f8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_f8.icon);
  QLocale::~QLocale(&local_f8.locale);
  QFont::~QFont(&local_f8.font);
  QStyleOption::~QStyleOption(&local_f8.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::openPersistentEditor(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    QStyleOptionViewItem options;
    initViewItemOption(&options);
    options.rect = visualRect(index);
    options.state |= (index == currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

    QWidget *editor = d->editor(index, options);
    if (editor) {
        editor->show();
        d->persistent.insert(editor);
    }
}